

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.tab.cc
# Opt level: O0

string * __thiscall
tchecker::parsing::program::parser_t::yytnamerr__abi_cxx11_
          (string *__return_storage_ptr__,parser_t *this,char *yystr)

{
  char cVar1;
  parser_t *ppVar2;
  allocator<char> local_39;
  int local_38;
  parser_t *local_28;
  char *yyp;
  parser_t *local_18;
  char *yystr_local;
  string *yyr;
  
  local_18 = this;
  yystr_local = (char *)__return_storage_ptr__;
  if (*(char *)&this->_vptr_parser_t == '\"') {
    yyp._7_1_ = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_28 = local_18;
    while( true ) {
      ppVar2 = (parser_t *)((long)&local_28->_vptr_parser_t + 1);
      cVar1 = *(char *)((long)&local_28->_vptr_parser_t + 1);
      if (cVar1 == '\"') break;
      if (((cVar1 == '\'') || (cVar1 == ',')) ||
         ((cVar1 == '\\' &&
          (ppVar2 = (parser_t *)((long)&local_28->_vptr_parser_t + 2),
          *(char *)((long)&local_28->_vptr_parser_t + 2) != '\\')))) {
        local_28 = ppVar2;
        local_38 = 0;
        goto LAB_00314e21;
      }
      local_28 = ppVar2;
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,*(char *)&local_28->_vptr_parser_t);
    }
    yyp._7_1_ = 1;
    local_38 = 1;
    local_28 = ppVar2;
LAB_00314e21:
    if ((yyp._7_1_ & 1) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    if (local_38 != 0) {
      return __return_storage_ptr__;
    }
  }
  ppVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)ppVar2,&local_39);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string
  parser_t::yytnamerr_ (const char *yystr)
  {
    if (*yystr == '"')
      {
        std::string yyr;
        char const *yyp = yystr;

        for (;;)
          switch (*++yyp)
            {
            case '\'':
            case ',':
              goto do_not_strip_quotes;

            case '\\':
              if (*++yyp != '\\')
                goto do_not_strip_quotes;
              else
                goto append;

            append:
            default:
              yyr += *yyp;
              break;

            case '"':
              return yyr;
            }
      do_not_strip_quotes: ;
      }

    return yystr;
  }